

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall slang::SVInt::set(SVInt *this,int32_t msb,int32_t lsb,SVInt *value)

{
  SVInt *pSVar1;
  int iVar2;
  uint uVar3;
  uint64_t *__s;
  sbyte sVar4;
  uint32_t length;
  SVInt *src;
  SVInt *pSVar5;
  ulong uVar6;
  uint srcOffset;
  byte bVar7;
  uint uVar8;
  ulong *__s_00;
  
  if (msb < lsb) {
    assert::assertFailed
              ("msb >= lsb",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
               ,0x5db,"void slang::SVInt::set(int32_t, int32_t, const SVInt &)");
  }
  uVar3 = (msb - lsb) + 1;
  if ((value->super_SVIntStorage).bitWidth == uVar3) {
    if ((-1 < msb) && (uVar8 = (this->super_SVIntStorage).bitWidth, lsb < (int)uVar8)) {
      srcOffset = lsb >> 0x1f & -lsb;
      iVar2 = ~msb + uVar8;
      if ((uint)msb < uVar8) {
        iVar2 = 0;
      }
      length = (uVar3 - srcOffset) + iVar2;
      bVar7 = (this->super_SVIntStorage).unknownFlag;
      if (((bool)bVar7 == false) && ((value->super_SVIntStorage).unknownFlag == true)) {
        uVar3 = uVar8 + 0x3f >> 6;
        uVar6 = (ulong)(uVar3 << 4);
        __s = (uint64_t *)operator_new__(uVar6);
        memset(__s,0,uVar6);
        pSVar1 = (SVInt *)(this->super_SVIntStorage).field_0.pVal;
        pSVar5 = this;
        if (0x40 < uVar8) {
          pSVar5 = pSVar1;
        }
        memcpy(__s,pSVar5,(ulong)uVar3);
        if (pSVar1 != (SVInt *)0x0 && 0x40 < uVar8) {
          operator_delete__(pSVar1);
          uVar8 = (this->super_SVIntStorage).bitWidth;
        }
        (this->super_SVIntStorage).unknownFlag = true;
        (this->super_SVIntStorage).field_0.pVal = __s;
        uVar3 = (value->super_SVIntStorage).bitWidth;
        bVar7 = 1;
      }
      pSVar1 = (SVInt *)(this->super_SVIntStorage).field_0.pVal;
      pSVar5 = this;
      if ((bVar7 & 1) != 0) {
        pSVar5 = pSVar1;
      }
      if (0x40 < uVar8) {
        pSVar5 = pSVar1;
      }
      uVar8 = 0;
      if (0 < lsb) {
        uVar8 = lsb;
      }
      pSVar1 = (SVInt *)(value->super_SVIntStorage).field_0.pVal;
      src = value;
      if (((value->super_SVIntStorage).unknownFlag & 1U) != 0) {
        src = pSVar1;
      }
      if (0x40 < uVar3) {
        src = pSVar1;
      }
      bitcpy((uint64_t *)pSVar5,uVar8,(uint64_t *)src,length,srcOffset);
      if ((value->super_SVIntStorage).unknownFlag == true) {
        uVar3 = (this->super_SVIntStorage).bitWidth;
        pSVar1 = (SVInt *)(this->super_SVIntStorage).field_0.val;
        pSVar5 = this;
        if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
          pSVar5 = pSVar1;
        }
        if (0x40 < uVar3) {
          pSVar5 = pSVar1;
        }
        bitcpy(&(&(pSVar5->super_SVIntStorage).field_0)[uVar3 + 0x3f >> 6].val,uVar8,
               (uint64_t *)
               ((ulong)((value->super_SVIntStorage).bitWidth + 0x3f >> 3 & 0xfffffff8) +
               (long)(value->super_SVIntStorage).field_0.pVal),length,srcOffset);
      }
      else if (((this->super_SVIntStorage).unknownFlag == true) && (length != 0)) {
        __s_00 = (this->super_SVIntStorage).field_0.pVal +
                 (ulong)((this->super_SVIntStorage).bitWidth + 0x3f >> 6) + (ulong)(uVar8 >> 6);
        uVar8 = uVar8 & 0x3f;
        if (uVar8 != 0) {
          uVar3 = 0x40 - uVar8;
          if (length <= 0x40 - uVar8) {
            uVar3 = length;
          }
          length = length - uVar3;
          *__s_00 = *__s_00 & ~(~(-1L << ((byte)uVar3 & 0x3f)) << (sbyte)uVar8);
          __s_00 = __s_00 + 1;
        }
        if (0x3f < length) {
          uVar6 = (ulong)((length >> 6) - 1);
          memset(__s_00,0,uVar6 * 8 + 8);
          __s_00 = __s_00 + uVar6 + 1;
        }
        if ((length & 0x3f) != 0) {
          sVar4 = (sbyte)(length & 0x3f);
          *__s_00 = (*__s_00 >> sVar4) << sVar4;
        }
      }
      clearUnusedBits(this);
      checkUnknown(this);
      return;
    }
    return;
  }
  assert::assertFailed
            ("value.getBitWidth() == selectWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x5de,"void slang::SVInt::set(int32_t, int32_t, const SVInt &)");
}

Assistant:

void SVInt::set(int32_t msb, int32_t lsb, const SVInt& value) {
    ASSERT(msb >= lsb);

    bitwidth_t selectWidth = bitwidth_t(msb - lsb + 1);
    ASSERT(value.getBitWidth() == selectWidth);
    if (msb < 0 || lsb >= int32_t(bitWidth))
        return;

    uint32_t frontOOB = lsb < 0 ? uint32_t(-lsb) : 0;
    uint32_t backOOB = bitwidth_t(msb) >= bitWidth ? bitwidth_t(msb - int32_t(bitWidth) + 1) : 0;
    uint32_t validSelectWidth = selectWidth - frontOOB - backOOB;

    if (!hasUnknown() && value.hasUnknown()) {
        uint64_t* newData = new uint64_t[getNumWords(bitWidth, true)]();
        memcpy(newData, getRawData(), getNumWords());

        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = newData;
    }

    bitcpy(getRawData(), (uint32_t)std::max(lsb, 0), value.getRawData(), validSelectWidth,
           frontOOB);
    if (value.unknownFlag) {
        bitcpy(getRawData() + getNumWords(bitWidth, false), (uint32_t)std::max(lsb, 0),
               value.getRawData() + getNumWords(value.bitWidth, false), validSelectWidth, frontOOB);
    }
    else if (unknownFlag) {
        // We have to unset any of the unknown bits for the given segment.
        clearBits(getRawData() + getNumWords(bitWidth, false), (uint32_t)std::max(lsb, 0),
                  validSelectWidth);
    }

    clearUnusedBits();
    checkUnknown();
}